

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeStamp.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::TimeStamp::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,TimeStamp *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  TimeStamp *local_18;
  TimeStamp *this_local;
  
  local_18 = this;
  this_local = (TimeStamp *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"Time Stamp:       ");
  ENUMS::GetEnumAsStringTimeStampType_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)((this->m_TimeStampUnion).m_ui32TimeStamp & 1),Value);
  poVar1 = std::operator<<(local_190,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_TimeStampUnion).m_ui32TimeStamp >> 1)
  ;
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString TimeStamp::GetAsString() const
{
    KStringStream ss;

    ss << "Time Stamp:       ";
    ss << GetEnumAsStringTimeStampType( m_TimeStampUnion.m_ui32TimeStampType ) << ": "
       << m_TimeStampUnion.m_ui32Time
       << "\n";

    return ss.str();
}